

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O3

bool __thiscall
wallet::CCrypter::Decrypt
          (CCrypter *this,span<const_unsigned_char,_18446744073709551615UL> ciphertext,
          CKeyingMaterial *plaintext)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  AES256CBCDecrypt dec;
  AES256CBCDecrypt local_132;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fKeySet == true) {
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
              (plaintext,ciphertext._M_extent._M_extent_value._M_extent_value);
    AES256CBCDecrypt::AES256CBCDecrypt
              (&local_132,
               (this->vchKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->vchIV).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,true);
    iVar1 = AES256CBCDecrypt::Decrypt
                      (&local_132,ciphertext._M_ptr,(int)ciphertext._M_extent._M_extent_value,
                       (plaintext->
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start);
    bVar2 = iVar1 != 0;
    if (bVar2) {
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize(plaintext,(long)iVar1);
    }
    AES256CBCDecrypt::~AES256CBCDecrypt(&local_132);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCrypter::Decrypt(const std::span<const unsigned char> ciphertext, CKeyingMaterial& plaintext) const
{
    if (!fKeySet)
        return false;

    // plaintext will always be equal to or lesser than length of ciphertext
    plaintext.resize(ciphertext.size());

    AES256CBCDecrypt dec(vchKey.data(), vchIV.data(), true);
    int len = dec.Decrypt(ciphertext.data(), ciphertext.size(), plaintext.data());
    if (len == 0) {
        return false;
    }
    plaintext.resize(len);
    return true;
}